

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.h
# Opt level: O0

void __thiscall mdsplit::mdsplitter::mdsplitter(mdsplitter *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  path local_f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cc;
  undefined1 local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  iterator local_80;
  size_type local_78;
  path local_70;
  path local_38;
  mdsplitter *local_10;
  mdsplitter *this_local;
  
  local_10 = this;
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&this->input_,(char (*) [10])"README.md",auto_format);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_70,(char (*) [5])"docs",auto_format);
  std::filesystem::__cxx11::operator/(&this->output_dir_,&local_38,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_38);
  local_cb = 1;
  local_c8 = &local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"details",&local_c9);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"summary",&local_ca);
  local_cb = 0;
  local_80 = &local_c0;
  local_78 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_cc);
  __l._M_len = local_78;
  __l._M_array = local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->clear_html_tags_,__l,&local_cc);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_cc);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  do {
    local_148 = local_148 + -1;
    std::__cxx11::string::~string((string *)local_148);
  } while (local_148 != &local_c0);
  std::allocator<char>::~allocator(&local_ca);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::string((string *)&this->repository_);
  this->max_split_level_ = 4;
  this->include_toc_ = true;
  this->jekyll_escape_ = true;
  this->indent_headers_ = true;
  this->add_front_matter_ = true;
  this->update_links_ = true;
  this->remove_autotoc_ = true;
  this->trace_ = true;
  this->erase_old_mdsplit_files_ = true;
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_f8,(char (*) [9])"index.md",auto_format);
  std::filesystem::__cxx11::operator/(&this->current_output_file_,&this->output_dir_,&local_f8);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::vector(&this->sections_);
  return;
}

Assistant:

mdsplitter() = default;